

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(data_view *data,DataType baseType,defV *val)

{
  DataType in_ESI;
  data_view *in_stack_000001c8;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  DataType DVar1;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  NamedPoint *in_stack_fffffffffffffee8;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_fffffffffffffef0;
  data_view *in_stack_fffffffffffffef8;
  allocator<char> *in_stack_ffffffffffffff00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  allocator<char> local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  long local_28;
  double local_20;
  DataType local_c;
  
  if ((in_ESI == HELICS_ANY) || (local_c = in_ESI, in_ESI == HELICS_UNKNOWN)) {
    data_view::bytes((data_view *)0x2b9602);
    local_c = detail::detectType((byte *)in_stack_fffffffffffffee8);
  }
  if (local_c == HELICS_UNKNOWN) goto LAB_002b97f7;
  if (local_c != HELICS_STRING) {
    if (local_c == HELICS_DOUBLE) {
      local_20 = ValueConverter<double>::interpret
                           ((data_view *)CONCAT44(1,in_stack_fffffffffffffed0));
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_fffffffffffffef0,(double *)in_stack_fffffffffffffee8);
      return;
    }
    if (local_c == HELICS_INT) {
LAB_002b9725:
      local_28 = ValueConverter<long>::interpret
                           ((data_view *)CONCAT44(local_c,in_stack_fffffffffffffed0));
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_fffffffffffffef0,(long *)in_stack_fffffffffffffee8);
      return;
    }
    if (local_c == HELICS_COMPLEX) {
      ValueConverter<std::complex<double>_>::interpret
                ((data_view *)CONCAT44(3,in_stack_fffffffffffffed0));
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_fffffffffffffef0,(complex<double> *)in_stack_fffffffffffffee8);
      return;
    }
    if (local_c == HELICS_VECTOR) {
      ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
                ((data_view *)in_stack_fffffffffffffee8);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_fffffffffffffef0,
                  (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8);
      CLI::std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffee0);
      return;
    }
    if (local_c == HELICS_COMPLEX_VECTOR) {
      ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
      interpret((data_view *)in_stack_fffffffffffffee8);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_fffffffffffffef0,
                  (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                  in_stack_fffffffffffffee8);
      CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffee0);
      return;
    }
    if (local_c == HELICS_NAMED_POINT) {
      ValueConverter<helics::NamedPoint>::interpret((data_view *)in_stack_fffffffffffffee8);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      NamedPoint::~NamedPoint((NamedPoint *)0x2b9906);
      return;
    }
    if (local_c != HELICS_BOOL) {
      if (local_c == HELICS_TIME) goto LAB_002b9725;
      if (local_c != HELICS_CHAR) {
        if (local_c != HELICS_CUSTOM) {
          if (local_c == HELICS_JSON) {
            DVar1 = local_c;
            readJsonValue_abi_cxx11_(in_stack_000001c8);
            std::
            variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
            ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)CONCAT44(DVar1,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8);
            CLI::std::
            variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
            ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        *)0x2b9936);
            return;
          }
          if (local_c != HELICS_MULTI) {
            if (local_c != HELICS_ANY) {
              return;
            }
            goto LAB_002b9754;
          }
        }
LAB_002b97f7:
        DVar1 = local_c;
        data_view::string_abi_cxx11_(in_stack_fffffffffffffef8);
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=(in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->name);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(DVar1,in_stack_fffffffffffffed0));
        return;
      }
    }
  }
LAB_002b9754:
  DVar1 = local_c;
  local_58 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                       ((data_view *)CONCAT44(local_c,in_stack_fffffffffffffed0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::
  variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
  ::operator=(in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->name);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(DVar1,in_stack_fffffffffffffed0));
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, defV& val)
{
    if (baseType == DataType::HELICS_ANY || baseType == DataType::HELICS_UNKNOWN) {
        baseType = detail::detectType(data.bytes());
    }
    switch (baseType) {
        case DataType::HELICS_DOUBLE:
            val = ValueConverter<double>::interpret(data);
            break;
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            val = ValueConverter<int64_t>::interpret(data);
            break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        case DataType::HELICS_BOOL:
        case DataType::HELICS_ANY:
            val = std::string(ValueConverter<std::string_view>::interpret(data));
            break;
        case DataType::HELICS_UNKNOWN:
        case DataType::HELICS_CUSTOM:
        case DataType::HELICS_MULTI:
            val = data.string();
            break;
        case DataType::HELICS_VECTOR:
            val = ValueConverter<std::vector<double>>::interpret(data);
            break;
        case DataType::HELICS_COMPLEX:
            val = ValueConverter<std::complex<double>>::interpret(data);
            break;
        case DataType::HELICS_COMPLEX_VECTOR:
            val = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            break;
        case DataType::HELICS_NAMED_POINT:
            val = ValueConverter<NamedPoint>::interpret(data);
            break;
        case DataType::HELICS_JSON:
            val = readJsonValue(data);
            break;
    }
}